

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::start(upnp *this)

{
  int iVar1;
  double __x;
  double __x_00;
  error_code ec;
  string local_30 [32];
  
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  open_multicast_socket(this,&this->m_multicast,&ec);
  if (ec.failed_ == true) {
    iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar1 == '\0') goto LAB_003302f1;
    (*(ec.cat_)->_vptr_error_category[4])(local_30,ec.cat_,(ulong)(uint)ec.val_);
    log(this,__x);
LAB_0033034b:
    ::std::__cxx11::string::~string(local_30);
    this->m_disabled = true;
  }
  else {
LAB_003302f1:
    open_unicast_socket(this,&this->m_unicast,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar1 != '\0') {
        (*(ec.cat_)->_vptr_error_category[4])(local_30,ec.cat_,(ulong)(uint)ec.val_);
        log(this,__x_00);
        goto LAB_0033034b;
      }
    }
    ::std::
    vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
    ::reserve(&(this->m_mappings).
               super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              ,2);
    discover_device_impl(this);
  }
  return;
}

Assistant:

void upnp::start()
{
	TORRENT_ASSERT(is_single_thread());

	error_code ec;
	open_multicast_socket(m_multicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open multicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	open_unicast_socket(m_unicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open unicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	m_mappings.reserve(2);

	discover_device_impl();
}